

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O1

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::CreateInputStream2
          (DefaultShaderSourceStreamFactory *this,Char *Name,
          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,IFileStream **ppStream)

{
  pointer pbVar1;
  pointer pcVar2;
  long *plVar3;
  bool bVar4;
  BasicFileStream *pObj_1;
  BasicFileStream *pObj;
  long *plVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> FullPath;
  long *local_70;
  char *local_68;
  CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS local_5c;
  long *local_58 [2];
  long local_48 [2];
  IFileStream **local_38;
  
  local_68 = Name;
  bVar4 = BasicFileSystem::IsPathAbsolute(Name);
  local_5c = Flags;
  local_38 = ppStream;
  if (bVar4) {
    CreateInputStream2::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_58,local_68);
    plVar5 = local_58[0];
    if (local_58[0] == (long *)0x0) {
      plVar5 = (long *)0x0;
    }
    else {
      local_58[0] = (long *)0x0;
    }
    if (local_58[0] != (long *)0x0) {
      (**(code **)(*local_58[0] + 0x10))();
      local_58[0] = (long *)0x0;
    }
  }
  else {
    pbVar6 = (this->m_SearchDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->m_SearchDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 == pbVar1) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)0x0;
      do {
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar2,pcVar2 + pbVar6->_M_string_length);
        std::__cxx11::string::append((char *)local_58);
        CreateInputStream2::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_70,(char *)local_58[0]);
        plVar3 = local_70;
        if (plVar5 != local_70) {
          local_70 = (long *)0x0;
          plVar5 = plVar3;
        }
        if (local_70 != (long *)0x0) {
          (**(code **)(*local_70 + 0x10))();
          local_70 = (long *)0x0;
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      } while ((plVar5 == (long *)0x0) && (pbVar6 = pbVar6 + 1, pbVar6 != pbVar1));
    }
  }
  if (plVar5 == (long *)0x0) {
    *local_38 = (IFileStream *)0x0;
    if ((local_5c & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) ==
        CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_NONE) {
      LogError<false,char[47],char_const*>
                (false,"CreateInputStream2",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                 ,0x76,(char (*) [47])"Failed to create input stream for source file ",&local_68);
    }
  }
  else {
    (**(code **)*plVar5)(plVar5,IID_FileStream,local_38);
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x10))(plVar5);
  }
  return;
}

Assistant:

void DefaultShaderSourceStreamFactory::CreateInputStream2(const Char*                             Name,
                                                          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,
                                                          IFileStream**                           ppStream)
{
    auto CreateFileStream = [](const char* Path) //
    {
        RefCntAutoPtr<BasicFileStream> pFileStream;
        if (FileSystem::FileExists(Path))
        {
            pFileStream = BasicFileStream::Create(Path, EFileAccessMode::Read);
            if (!pFileStream->IsValid())
                pFileStream.Release();
        }
        return pFileStream;
    };

    RefCntAutoPtr<BasicFileStream> pFileStream;
    if (FileSystem::IsPathAbsolute(Name))
    {
        pFileStream = CreateFileStream(Name);
    }
    else
    {
        for (const auto& SearchDir : m_SearchDirectories)
        {
            const auto FullPath = SearchDir + ((Name[0] == '\\' || Name[0] == '/') ? Name + 1 : Name);
            pFileStream         = CreateFileStream(FullPath.c_str());
            if (pFileStream)
                break;
        }
    }

    if (pFileStream)
    {
        pFileStream->QueryInterface(IID_FileStream, reinterpret_cast<IObject**>(ppStream));
    }
    else
    {
        *ppStream = nullptr;
        if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) == 0)
        {
            LOG_ERROR("Failed to create input stream for source file ", Name);
        }
    }
}